

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool gl4cts::EnhancedLayouts::Utils::checkProgramStage
               (Program *program,ProgramInterface *program_interface,STAGES stage,bool check_inputs,
               bool check_outputs,bool check_uniforms,bool check_ssbs,stringstream *stream)

{
  bool bVar1;
  ShaderInterface *pSVar2;
  reference ppVVar3;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_90;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_88;
  const_iterator it_3;
  PtrVector *ssbs;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_70;
  const_iterator it_2;
  PtrVector *uniforms;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_58;
  const_iterator it_1;
  PtrVector *outputs;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_40;
  const_iterator it;
  PtrVector *inputs;
  bool result;
  ShaderInterface *interface;
  bool check_ssbs_local;
  bool check_uniforms_local;
  bool check_outputs_local;
  bool check_inputs_local;
  STAGES stage_local;
  ProgramInterface *program_interface_local;
  Program *program_local;
  
  pSVar2 = ProgramInterface::GetShaderInterface(program_interface,stage);
  inputs._7_1_ = true;
  if (check_inputs) {
    it._M_current = (Variable **)&pSVar2->m_inputs;
    local_40._M_current =
         (Variable **)
         std::
         vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
         ::begin((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  *)it._M_current);
    while( true ) {
      outputs = (PtrVector *)
                std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::end((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                       *)it._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                          *)&outputs);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_40);
      bVar1 = checkVarying(program,*ppVVar3,stream,true);
      if (!bVar1) {
        inputs._7_1_ = false;
      }
      __gnu_cxx::
      __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
      ::operator++(&local_40);
    }
  }
  if (check_outputs) {
    it_1._M_current = (Variable **)&pSVar2->m_outputs;
    local_58._M_current =
         (Variable **)
         std::
         vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
         ::begin((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  *)it_1._M_current);
    while( true ) {
      uniforms = (PtrVector *)
                 std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                 ::end((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        *)it_1._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_58,
                         (__normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                          *)&uniforms);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_58);
      bVar1 = checkVarying(program,*ppVVar3,stream,false);
      if (!bVar1) {
        inputs._7_1_ = false;
      }
      __gnu_cxx::
      __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
      ::operator++(&local_58);
    }
  }
  if (check_uniforms) {
    it_2._M_current = (Variable **)&pSVar2->m_uniforms;
    local_70._M_current =
         (Variable **)
         std::
         vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
         ::begin((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  *)it_2._M_current);
    while( true ) {
      ssbs = (PtrVector *)
             std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
             ::end((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                    *)it_2._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                          *)&ssbs);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_70);
      bVar1 = checkUniform(program,*ppVVar3,stream);
      if (!bVar1) {
        inputs._7_1_ = false;
      }
      __gnu_cxx::
      __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
      ::operator++(&local_70);
    }
  }
  if (check_ssbs) {
    it_3._M_current = (Variable **)&pSVar2->m_ssb_blocks;
    local_88._M_current =
         (Variable **)
         std::
         vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
         ::begin((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  *)it_3._M_current);
    while( true ) {
      local_90._M_current =
           (Variable **)
           std::
           vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
           ::end(it_3._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_88);
      bVar1 = checkSSB(program,*ppVVar3,stream);
      if (!bVar1) {
        inputs._7_1_ = false;
      }
      __gnu_cxx::
      __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_*const_*,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
      ::operator++(&local_88);
    }
  }
  return inputs._7_1_;
}

Assistant:

bool checkProgramStage(Program& program, const ProgramInterface& program_interface, Utils::Shader::STAGES stage,
					   bool check_inputs, bool check_outputs, bool check_uniforms, bool check_ssbs,
					   std::stringstream& stream)
{
	typedef Variable::PtrVector::const_iterator const_iterator;

	const ShaderInterface& interface = program_interface.GetShaderInterface(stage);

	bool result = true;

	/* Inputs */
	if (true == check_inputs)
	{
		const Variable::PtrVector& inputs = interface.m_inputs;

		for (const_iterator it = inputs.begin(); it != inputs.end(); ++it)
		{
			if (false == checkVarying(program, **it, stream, true))
			{
				result = false;
			}
		}
	}

	/* Outputs */
	if (true == check_outputs)
	{
		const Variable::PtrVector& outputs = interface.m_outputs;

		for (const_iterator it = outputs.begin(); it != outputs.end(); ++it)
		{
			if (false == checkVarying(program, **it, stream, false))
			{
				result = false;
			}
		}
	}

	/* Uniforms */
	if (true == check_uniforms)
	{
		const Variable::PtrVector& uniforms = interface.m_uniforms;

		for (const_iterator it = uniforms.begin(); it != uniforms.end(); ++it)
		{
			if (false == checkUniform(program, **it, stream))
			{
				result = false;
			}
		}
	}

	/* SSBs */
	if (true == check_ssbs)
	{
		const Variable::PtrVector& ssbs = interface.m_ssb_blocks;

		for (const_iterator it = ssbs.begin(); it != ssbs.end(); ++it)
		{
			if (false == checkSSB(program, **it, stream))
			{
				result = false;
			}
		}
	}

	return result;
}